

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O3

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowViolation(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *maxviol,
                 number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *sumviol)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  cpp_dec_float<50U,_int,_void> *pcVar5;
  ulong uVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  activity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  cpp_dec_float<50U,_int,_void> local_138;
  cpp_dec_float<50U,_int,_void> *local_100;
  cpp_dec_float<50U,_int,_void> local_f8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_b8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  local_100 = &sumviol->m_backend;
  if ((this->_hasSolReal != true) || (((this->_solReal).field_0xc8 & 1) == 0)) {
    if ((this->_hasSolRational != true) || (((this->_solRational).field_0xd0 & 1) == 0)) {
      return false;
    }
    if (this->_hasSolReal == false) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   *)&this->_solReal,&this->_solRational);
      this->_hasSolReal = true;
    }
  }
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_b8,
               (this->_realLP->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  (*(this->_realLP->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x46])(this->_realLP,&this->_solReal,&local_b8,1);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_100,0.0);
  uVar6 = (ulong)(this->_realLP->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
  if (0 < (long)uVar6) {
    lVar4 = uVar6 * 0x38;
    do {
      iVar3 = (int)(uVar6 - 1);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::lhsUnscaled((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_a0,this->_realLP,iVar3);
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::rhsUnscaled((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_68,this->_realLP,iVar3);
      pcVar5 = (cpp_dec_float<50U,_int,_void> *)
               ((long)local_b8.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems + lVar4)
      ;
      local_138.fpclass = cpp_dec_float_finite;
      local_138.prec_elem = 10;
      local_138.data._M_elems[0] = 0;
      local_138.data._M_elems[1] = 0;
      local_138.data._M_elems[2] = 0;
      local_138.data._M_elems[3] = 0;
      local_138.data._M_elems[4] = 0;
      local_138.data._M_elems[5] = 0;
      local_138.data._M_elems._24_5_ = 0;
      local_138.data._M_elems[7]._1_3_ = 0;
      local_138.data._M_elems._32_5_ = 0;
      local_138.data._M_elems[9]._1_3_ = 0;
      local_138.exp = 0;
      local_138.neg = false;
      if (pcVar5 == &local_138) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_138,&local_a0);
        if (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite) {
          local_138.neg = (bool)(local_138.neg ^ 1);
          goto LAB_0034de86;
        }
LAB_0034de8f:
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems._24_5_ = 0;
        local_f8.data._M_elems[7]._1_3_ = 0;
        local_f8.data._M_elems._32_5_ = 0;
        local_f8.data._M_elems[9]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_f8,0.0);
        iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_138,&local_f8);
        if (0 < iVar3) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (local_100,&local_138);
          if (((local_138.fpclass != cpp_dec_float_NaN) &&
              ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_138,&maxviol->m_backend), 0 < iVar3)) {
            *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
                 CONCAT35(local_138.data._M_elems[9]._1_3_,local_138.data._M_elems._32_5_);
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_138.data._M_elems._16_8_
            ;
            *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
                 CONCAT35(local_138.data._M_elems[7]._1_3_,local_138.data._M_elems._24_5_);
            *(undefined8 *)(maxviol->m_backend).data._M_elems = local_138.data._M_elems._0_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_138.data._M_elems._8_8_;
            (maxviol->m_backend).exp = local_138.exp;
            (maxviol->m_backend).neg = local_138.neg;
            (maxviol->m_backend).fpclass = local_138.fpclass;
            (maxviol->m_backend).prec_elem = local_138.prec_elem;
          }
        }
      }
      else {
        local_138.data._M_elems._32_5_ = local_a0.data._M_elems._32_5_;
        local_138.data._M_elems[9]._1_3_ = local_a0.data._M_elems[9]._1_3_;
        local_138.data._M_elems[4] = local_a0.data._M_elems[4];
        local_138.data._M_elems[5] = local_a0.data._M_elems[5];
        local_138.data._M_elems._24_5_ = local_a0.data._M_elems._24_5_;
        local_138.data._M_elems[7]._1_3_ = local_a0.data._M_elems[7]._1_3_;
        local_138.data._M_elems[0] = local_a0.data._M_elems[0];
        local_138.data._M_elems[1] = local_a0.data._M_elems[1];
        local_138.data._M_elems[2] = local_a0.data._M_elems[2];
        local_138.data._M_elems[3] = local_a0.data._M_elems[3];
        local_138.exp = local_a0.exp;
        local_138.neg = local_a0.neg;
        local_138.fpclass = local_a0.fpclass;
        local_138.prec_elem = local_a0.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_138,pcVar5);
LAB_0034de86:
        if (local_138.fpclass != cpp_dec_float_NaN) goto LAB_0034de8f;
      }
      pcVar5 = (cpp_dec_float<50U,_int,_void> *)
               ((long)local_b8.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems + lVar4)
      ;
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      if (pcVar5 != &local_f8) {
        uVar1 = *(undefined8 *)((pcVar5->data)._M_elems + 8);
        local_f8.data._M_elems._32_5_ = SUB85(uVar1,0);
        local_f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
        local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar5->data)._M_elems;
        local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 2);
        local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar5->data)._M_elems + 4);
        uVar1 = *(undefined8 *)((pcVar5->data)._M_elems + 6);
        local_f8.data._M_elems._24_5_ = SUB85(uVar1,0);
        local_f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar1 >> 0x28);
        local_f8.exp = *(int *)((long)(&local_b8.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data
                                      + 1) + lVar4);
        local_f8.neg = *(bool *)((long)(&local_b8.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data + 1) + lVar4 + 4);
        local_f8._48_8_ =
             *(undefined8 *)
              ((long)(&local_b8.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1) + lVar4 + 8
              );
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                (&local_f8,&local_68);
      local_138.data._M_elems._32_5_ = local_f8.data._M_elems._32_5_;
      local_138.data._M_elems[9]._1_3_ = local_f8.data._M_elems[9]._1_3_;
      local_138.data._M_elems[4] = local_f8.data._M_elems[4];
      local_138.data._M_elems[5] = local_f8.data._M_elems[5];
      local_138.data._M_elems._24_5_ = local_f8.data._M_elems._24_5_;
      local_138.data._M_elems[7]._1_3_ = local_f8.data._M_elems[7]._1_3_;
      local_138.data._M_elems[0] = local_f8.data._M_elems[0];
      local_138.data._M_elems[1] = local_f8.data._M_elems[1];
      local_138.data._M_elems[2] = local_f8.data._M_elems[2];
      local_138.data._M_elems[3] = local_f8.data._M_elems[3];
      local_138.exp = local_f8.exp;
      local_138.neg = local_f8.neg;
      local_138.fpclass = local_f8.fpclass;
      local_138.prec_elem = local_f8.prec_elem;
      if (local_f8.fpclass != cpp_dec_float_NaN) {
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems._24_5_ = 0;
        local_f8.data._M_elems[7]._1_3_ = 0;
        local_f8.data._M_elems._32_5_ = 0;
        local_f8.data._M_elems[9]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_f8,0.0);
        iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_138,&local_f8);
        if (0 < iVar3) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                    (local_100,&local_138);
          if (((local_138.fpclass != cpp_dec_float_NaN) &&
              ((maxviol->m_backend).fpclass != cpp_dec_float_NaN)) &&
             (iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_138,&maxviol->m_backend), 0 < iVar3)) {
            *(ulong *)((maxviol->m_backend).data._M_elems + 8) =
                 CONCAT35(local_138.data._M_elems[9]._1_3_,local_138.data._M_elems._32_5_);
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 4) = local_138.data._M_elems._16_8_
            ;
            *(ulong *)((maxviol->m_backend).data._M_elems + 6) =
                 CONCAT35(local_138.data._M_elems[7]._1_3_,local_138.data._M_elems._24_5_);
            *(undefined8 *)(maxviol->m_backend).data._M_elems = local_138.data._M_elems._0_8_;
            *(undefined8 *)((maxviol->m_backend).data._M_elems + 2) = local_138.data._M_elems._8_8_;
            (maxviol->m_backend).exp = local_138.exp;
            (maxviol->m_backend).neg = local_138.neg;
            (maxviol->m_backend).fpclass = local_138.fpclass;
            (maxviol->m_backend).prec_elem = local_138.prec_elem;
          }
        }
      }
      bVar2 = 1 < uVar6;
      uVar6 = uVar6 - 1;
      lVar4 = lVar4 + -0x38;
    } while (bVar2);
  }
  if (local_b8.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool SoPlexBase<R>::getRowViolation(R& maxviol, R& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   _syncRealSolution();
   VectorBase<R>& primal = _solReal._primal;
   assert(primal.dim() == numCols());

   VectorBase<R> activity(numRows());
   _realLP->computePrimalActivity(primal, activity, true);
   maxviol = 0.0;
   sumviol = 0.0;

   for(int i = numRows() - 1; i >= 0; i--)
   {
      R lhs = _realLP->lhsUnscaled(i);
      R rhs = _realLP->rhsUnscaled(i);

      R viol = lhs - activity[i];

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }

      viol = activity[i] - rhs;

      if(viol > 0.0)
      {
         sumviol += viol;

         if(viol > maxviol)
            maxviol = viol;
      }
   }

   return true;
}